

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O1

void __thiscall
wabt::interp::RefPtr<wabt::interp::Foreign>::RefPtr
          (RefPtr<wabt::interp::Foreign> *this,Store *store,Ref ref)

{
  Object *pOVar1;
  Foreign *pFVar2;
  Index IVar3;
  interp *this_00;
  
  pOVar1 = (store->objects_).list_.
           super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
           _M_impl.super__Vector_impl_data._M_start[ref.index];
  if ((((ulong)pOVar1 & 1) == 0) && (pOVar1->kind_ == Foreign)) {
    IVar3 = Store::NewRoot(store,ref);
    this->root_index_ = IVar3;
    pFVar2 = (Foreign *)
             (store->objects_).list_.
             super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
             _M_impl.super__Vector_impl_data._M_start[ref.index];
    if (((ulong)pFVar2 & 1) == 0) {
      this->obj_ = pFVar2;
      this->store_ = store;
      return;
    }
  }
  else {
    this_00 = (interp *)0x0;
    if (ref.index != 0) {
      if (((ulong)pOVar1 & 1) != 0) goto LAB_001da9d0;
      this_00 = (interp *)(ulong)pOVar1->kind_;
    }
    interp::RefPtr(this_00);
  }
LAB_001da9d0:
  __assert_fail("IsUsed(index)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/interp/interp-inl.h"
                ,0xe6,
                "T &wabt::interp::FreeList<wabt::interp::Object *>::Get(Index) [T = wabt::interp::Object *]"
               );
}

Assistant:

RefPtr<T>::RefPtr(Store& store, Ref ref) {
#ifndef NDEBUG
  if (!store.Is<T>(ref)) {
    ObjectKind ref_kind;
    if (ref == Ref::Null) {
      ref_kind = ObjectKind::Null;
    } else {
      ref_kind = store.objects_.Get(ref.index)->kind();
    }
    fprintf(stderr, "Invalid conversion from Ref (%s) to RefPtr<%s>!\n",
            GetName(ref_kind), T::GetTypeName());
    abort();
  }
#endif
  root_index_ = store.NewRoot(ref);
  obj_ = static_cast<T*>(store.objects_.Get(ref.index));
  store_ = &store;
}